

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpccheck.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  ostringstream *this;
  int read_size;
  char *pcVar5;
  long lVar6;
  allocator local_4ba;
  bool is_stable;
  int local_4b8;
  int num_order;
  string local_4b0;
  double local_490;
  double margin;
  ulong local_480;
  Buffer buffer;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  ostringstream error_message_5;
  LinearPredictiveCoefficientsStabilityCheck linear_predictive_coefficients_stability_check;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_order = 0x19;
  margin = 1e-16;
  local_4b8 = 1;
  local_480 = 0;
LAB_00103645:
  do {
    while( true ) {
      while( true ) {
        iVar3 = ya_getopt_long(argc,argv,"m:e:r:xh",(option *)0x0,(int *)0x0);
        if (iVar3 != 0x6d) break;
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
        bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
        local_490 = (double)CONCAT71(local_490._1_7_,-1 < num_order);
        std::__cxx11::string::~string((string *)&ifs);
        if ((local_490._0_1_ & bVar1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
          std::operator<<(poVar4,"non-negative integer");
          std::__cxx11::string::string((string *)&error_message_5,"lpccheck",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
          goto LAB_001038cc;
        }
      }
      if (iVar3 != 0x72) break;
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&margin);
      if (!bVar1 || margin <= 0.0) {
        std::__cxx11::string::~string((string *)&ifs);
        goto LAB_0010387f;
      }
      local_490 = margin;
      std::__cxx11::string::~string((string *)&ifs);
      if (1.0 <= local_490) {
LAB_0010387f:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -r option must be in (0.0, 1.0)");
        std::__cxx11::string::string((string *)&error_message_5,"lpccheck",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_001038cc:
        std::__cxx11::string::~string((string *)&error_message_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar3 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string((string *)&error_message_5,"lpccheck",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001038cc;
      }
      if (argc == ya_optind) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Cannot set translation mode");
        std::__cxx11::string::string((string *)&error_message_5,"lpccheck",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001038cc;
      }
      std::ifstream::ifstream(this);
      if ((pcVar5 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        poVar4 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
        std::operator<<(poVar4,pcVar5);
        std::__cxx11::string::string
                  ((string *)&buffer,"lpccheck",
                   (allocator *)&linear_predictive_coefficients_stability_check);
        sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar3 = 1;
        goto LAB_00103e07;
      }
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        this = (ostringstream *)&std::cin;
      }
      sptk::LinearPredictiveCoefficientsStabilityCheck::LinearPredictiveCoefficientsStabilityCheck
                (&linear_predictive_coefficients_stability_check,num_order,margin);
      buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00110be0;
      buffer.conversion_buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00110c10;
      buffer.conversion_buffer_.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.conversion_buffer_.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.conversion_buffer_.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.reconversion_buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00110c40;
      buffer.reconversion_buffer_.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.reconversion_buffer_.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.reconversion_buffer_.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.parcor_coefficients_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.parcor_coefficients_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.parcor_coefficients_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (linear_predictive_coefficients_stability_check.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,
                        "Failed to initialize LinearPredictiveCoefficientsStabilityCheck");
        std::__cxx11::string::string
                  ((string *)&local_4b0,"lpccheck",(allocator *)&linear_predictive_coefficients);
        sptk::PrintErrorMessage(&local_4b0,&error_message_5);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        iVar3 = 1;
        goto LAB_00103dfd;
      }
      lVar6 = (long)num_order;
      std::vector<double,_std::allocator<double>_>::vector
                (&linear_predictive_coefficients,lVar6 + 1U,(allocator_type *)&error_message_5);
      iVar3 = 0;
      break;
    }
    if (iVar3 == 0x65) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&buffer);
      if (bVar1) {
        bVar1 = sptk::IsInRange((int)buffer._vptr_Buffer,0,2);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar1) {
          local_4b8 = (int)buffer._vptr_Buffer;
          goto LAB_00103645;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -e option must be an integer ")
      ;
      poVar4 = std::operator<<(poVar4,"in the range of ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
      poVar4 = std::operator<<(poVar4," to ");
      std::ostream::operator<<((ostream *)poVar4,2);
      std::__cxx11::string::string
                ((string *)&error_message_5,"lpccheck",
                 (allocator *)&linear_predictive_coefficients_stability_check);
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      goto LAB_001038cc;
    }
    if (iVar3 == 0x68) {
      anon_unknown.dwarf_2b0e::PrintUsage((ostream *)&std::cout);
      return 0;
    }
    if (iVar3 != 0x78) {
      anon_unknown.dwarf_2b0e::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    local_480 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
  } while( true );
LAB_00103ade:
  read_size = (int)(lVar6 + 1U);
  bVar1 = sptk::ReadStream<double>
                    (false,0,0,read_size,&linear_predictive_coefficients,(istream *)this,(int *)0x0)
  ;
  if (!bVar1) {
    iVar3 = 0;
LAB_00103df0:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&linear_predictive_coefficients.super__Vector_base<double,_std::allocator<double>_>);
LAB_00103dfd:
    sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer::~Buffer(&buffer);
LAB_00103e07:
    std::ifstream::~ifstream(&ifs);
    return iVar3;
  }
  is_stable = false;
  if ((local_480 & 1) != 0) {
    bVar1 = sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                      (&linear_predictive_coefficients_stability_check,
                       &linear_predictive_coefficients,&is_stable,&buffer);
    if (bVar1) {
      bVar1 = sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                        (&linear_predictive_coefficients_stability_check,
                         &linear_predictive_coefficients,
                         (vector<double,_std::allocator<double>_> *)0x0,&is_stable,&buffer);
      if (bVar1) {
        if (local_4b8 != 0 && (is_stable & 1U) == 0) goto LAB_00103b6a;
        goto LAB_00103bc6;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,
                      "Failed to check stability of linear predictive coefficients");
      std::__cxx11::string::string((string *)&local_4b0,"lpccheck",&local_4ba);
      sptk::PrintErrorMessage(&local_4b0,&error_message_5);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,
                      "Failed to check stability of linear predictive coefficients");
      std::__cxx11::string::string((string *)&local_4b0,"lpccheck",&local_4ba);
      sptk::PrintErrorMessage(&local_4b0,&error_message_5);
    }
LAB_00103dd6:
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
LAB_00103ded:
    iVar3 = 1;
    goto LAB_00103df0;
  }
  if (local_4b8 != 0) {
LAB_00103b6a:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&error_message_5,iVar3);
    std::operator<<(poVar4,"th frame is unstable");
    std::__cxx11::string::string((string *)&local_4b0,"lpccheck",&local_4ba);
    sptk::PrintErrorMessage(&local_4b0,&error_message_5);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
    if (local_4b8 != 2) goto LAB_00103bc6;
    goto LAB_00103ded;
  }
LAB_00103bc6:
  bVar1 = sptk::WriteStream<double>
                    (0,read_size,&linear_predictive_coefficients,(ostream *)&std::cout,(int *)0x0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    std::operator<<((ostream *)&error_message_5,"Failed to write linear predictive coefficients");
    std::__cxx11::string::string((string *)&local_4b0,"lpccheck",&local_4ba);
    sptk::PrintErrorMessage(&local_4b0,&error_message_5);
    goto LAB_00103dd6;
  }
  iVar3 = iVar3 + 1;
  goto LAB_00103ade;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  WarningType warning_type(kDefaultWarningType);
  double margin(kDefaultMargin);
  bool modification_flag(kDefaultModificationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:e:r:xh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'r': {
        if (!sptk::ConvertStringToDouble(optarg, &margin) || margin <= 0.0 ||
            1.0 <= margin) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -r option must be in (0.0, 1.0)";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'x': {
        modification_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_rest_args(argc - optind);
  if (1 < num_rest_args) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }
  const char* input_file(0 == num_rest_args ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LinearPredictiveCoefficientsStabilityCheck
      linear_predictive_coefficients_stability_check(num_order, margin);
  sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer buffer;
  if (!linear_predictive_coefficients_stability_check.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize LinearPredictiveCoefficientsStabilityCheck";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> linear_predictive_coefficients(length);

  for (int frame_index(0);
       sptk::ReadStream(false, 0, 0, length, &linear_predictive_coefficients,
                        &input_stream, NULL);
       ++frame_index) {
    bool is_stable(false);
    if (modification_flag) {
      if (!linear_predictive_coefficients_stability_check.Run(
              &linear_predictive_coefficients, &is_stable, &buffer)) {
        std::ostringstream error_message;
        error_message
            << "Failed to check stability of linear predictive coefficients";
        sptk::PrintErrorMessage("lpccheck", error_message);
        return 1;
      } else {
        if (!linear_predictive_coefficients_stability_check.Run(
                linear_predictive_coefficients, NULL, &is_stable, &buffer)) {
          std::ostringstream error_message;
          error_message
              << "Failed to check stability of linear predictive coefficients";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
      }
    }

    if (!is_stable && kIgnore != warning_type) {
      std::ostringstream error_message;
      error_message << frame_index << "th frame is unstable";
      sptk::PrintErrorMessage("lpccheck", error_message);
      if (kExit == warning_type) return 1;
    }

    if (!sptk::WriteStream(0, length, linear_predictive_coefficients,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write linear predictive coefficients";
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }

  return 0;
}